

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  bool bVar1;
  undefined1 uVar2;
  CppType CVar3;
  EnumDescriptor *__lhs;
  FieldDescriptor *in_RCX;
  string *in_RSI;
  long in_RDI;
  EnumValueDescriptor *enum_value;
  EnumDescriptor *enum_type;
  int64 int_value;
  string value_9;
  string value_8;
  uint64 value_7;
  string value_6;
  double value_5;
  double value_4;
  uint64 value_3;
  int64 value_2;
  uint64 value_1;
  int64 value;
  undefined4 in_stack_fffffffffffffb88;
  TokenType in_stack_fffffffffffffb8c;
  ParserImpl *in_stack_fffffffffffffb90;
  LogMessage *this_00;
  string *in_stack_fffffffffffffb98;
  int32 value_00;
  uint32 value_01;
  int value_02;
  undefined5 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba5;
  undefined1 in_stack_fffffffffffffba6;
  undefined1 in_stack_fffffffffffffba7;
  string *in_stack_fffffffffffffba8;
  Reflection *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbc;
  byte in_stack_fffffffffffffbbd;
  undefined1 in_stack_fffffffffffffbbe;
  undefined1 in_stack_fffffffffffffbbf;
  Reflection *in_stack_fffffffffffffbc0;
  ParserImpl *in_stack_fffffffffffffbc8;
  undefined6 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd6;
  undefined1 in_stack_fffffffffffffbd7;
  char *in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  ParserImpl *in_stack_fffffffffffffbf8;
  Reflection *in_stack_fffffffffffffc00;
  uint64 in_stack_fffffffffffffc08;
  Message *in_stack_fffffffffffffc10;
  ParserImpl *in_stack_fffffffffffffc18;
  double *in_stack_fffffffffffffc60;
  ParserImpl *in_stack_fffffffffffffc68;
  LogMessage local_378;
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [80];
  string local_1f0 [39];
  undefined1 local_1c9 [33];
  Reflection *local_1a8;
  EnumDescriptor *local_1a0;
  long local_198;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [40];
  string local_c8 [32];
  string local_a8 [32];
  int local_88;
  string local_78 [80];
  FieldDescriptor *local_28;
  string *local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x715714);
  switch(CVar3) {
  case CPPTYPE_INT32:
    bVar1 = ConsumeSignedInteger
                      (in_stack_fffffffffffffbf8,
                       (int64 *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                       (uint64)in_stack_fffffffffffffbe8);
    value_00 = (int32)((ulong)in_stack_fffffffffffffb98 >> 0x20);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_007169fb;
    }
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x71577d);
    if (bVar1) {
      Reflection::AddInt32
                (in_stack_fffffffffffffbc0,
                 (Message *)
                 CONCAT17(in_stack_fffffffffffffbbf,
                          CONCAT16(in_stack_fffffffffffffbbe,
                                   CONCAT15(in_stack_fffffffffffffbbd,
                                            CONCAT14(in_stack_fffffffffffffbbc,
                                                     in_stack_fffffffffffffbb8)))),
                 (FieldDescriptor *)in_stack_fffffffffffffbb0,
                 (int32)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    }
    else {
      Reflection::SetInt32
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                 (FieldDescriptor *)
                 CONCAT17(in_stack_fffffffffffffba7,
                          CONCAT16(in_stack_fffffffffffffba6,
                                   CONCAT15(in_stack_fffffffffffffba5,in_stack_fffffffffffffba0))),
                 value_00);
    }
    break;
  case CPPTYPE_INT64:
    bVar1 = ConsumeSignedInteger
                      (in_stack_fffffffffffffbf8,
                       (int64 *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                       (uint64)in_stack_fffffffffffffbe8);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_007169fb;
    }
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x7158b0);
    if (bVar1) {
      Reflection::AddInt64
                (in_stack_fffffffffffffbc0,
                 (Message *)
                 CONCAT17(in_stack_fffffffffffffbbf,
                          CONCAT16(in_stack_fffffffffffffbbe,
                                   CONCAT15(in_stack_fffffffffffffbbd,
                                            CONCAT14(in_stack_fffffffffffffbbc,
                                                     in_stack_fffffffffffffbb8)))),
                 (FieldDescriptor *)in_stack_fffffffffffffbb0,(int64)in_stack_fffffffffffffba8);
    }
    else {
      Reflection::SetInt64
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                 (FieldDescriptor *)
                 CONCAT17(in_stack_fffffffffffffba7,
                          CONCAT16(in_stack_fffffffffffffba6,
                                   CONCAT15(in_stack_fffffffffffffba5,in_stack_fffffffffffffba0))),
                 (int64)in_stack_fffffffffffffb98);
    }
    break;
  case CPPTYPE_UINT32:
    bVar1 = ConsumeUnsignedInteger
                      (in_stack_fffffffffffffc18,(uint64 *)in_stack_fffffffffffffc10,
                       in_stack_fffffffffffffc08);
    value_01 = (uint32)((ulong)in_stack_fffffffffffffb98 >> 0x20);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_007169fb;
    }
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x715814);
    if (bVar1) {
      Reflection::AddUInt32
                (in_stack_fffffffffffffbc0,
                 (Message *)
                 CONCAT17(in_stack_fffffffffffffbbf,
                          CONCAT16(in_stack_fffffffffffffbbe,
                                   CONCAT15(in_stack_fffffffffffffbbd,
                                            CONCAT14(in_stack_fffffffffffffbbc,
                                                     in_stack_fffffffffffffbb8)))),
                 (FieldDescriptor *)in_stack_fffffffffffffbb0,
                 (uint32)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    }
    else {
      Reflection::SetUInt32
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                 (FieldDescriptor *)
                 CONCAT17(in_stack_fffffffffffffba7,
                          CONCAT16(in_stack_fffffffffffffba6,
                                   CONCAT15(in_stack_fffffffffffffba5,in_stack_fffffffffffffba0))),
                 value_01);
    }
    break;
  case CPPTYPE_UINT64:
    bVar1 = ConsumeUnsignedInteger
                      (in_stack_fffffffffffffc18,(uint64 *)in_stack_fffffffffffffc10,
                       in_stack_fffffffffffffc08);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_007169fb;
    }
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x715945);
    if (bVar1) {
      Reflection::AddUInt64
                (in_stack_fffffffffffffbc0,
                 (Message *)
                 CONCAT17(in_stack_fffffffffffffbbf,
                          CONCAT16(in_stack_fffffffffffffbbe,
                                   CONCAT15(in_stack_fffffffffffffbbd,
                                            CONCAT14(in_stack_fffffffffffffbbc,
                                                     in_stack_fffffffffffffbb8)))),
                 (FieldDescriptor *)in_stack_fffffffffffffbb0,(uint64)in_stack_fffffffffffffba8);
    }
    else {
      Reflection::SetUInt64
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                 (FieldDescriptor *)
                 CONCAT17(in_stack_fffffffffffffba7,
                          CONCAT16(in_stack_fffffffffffffba6,
                                   CONCAT15(in_stack_fffffffffffffba5,in_stack_fffffffffffffba0))),
                 (uint64)in_stack_fffffffffffffb98);
    }
    break;
  case CPPTYPE_DOUBLE:
    bVar1 = ConsumeDouble(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_007169fb;
    }
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x715acd);
    if (bVar1) {
      Reflection::AddDouble
                (in_stack_fffffffffffffbc0,
                 (Message *)
                 CONCAT17(in_stack_fffffffffffffbbf,
                          CONCAT16(in_stack_fffffffffffffbbe,
                                   CONCAT15(in_stack_fffffffffffffbbd,
                                            CONCAT14(in_stack_fffffffffffffbbc,
                                                     in_stack_fffffffffffffbb8)))),
                 (FieldDescriptor *)in_stack_fffffffffffffbb0,(double)in_stack_fffffffffffffba8);
    }
    else {
      Reflection::SetDouble
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                 (FieldDescriptor *)
                 CONCAT17(in_stack_fffffffffffffba7,
                          CONCAT16(in_stack_fffffffffffffba6,
                                   CONCAT15(in_stack_fffffffffffffba5,in_stack_fffffffffffffba0))),
                 (double)in_stack_fffffffffffffb98);
    }
    break;
  case CPPTYPE_FLOAT:
    bVar1 = ConsumeDouble(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_007169fb;
    }
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x7159d3);
    if (bVar1) {
      io::SafeDoubleToFloat((double)in_stack_fffffffffffffb98);
      Reflection::AddFloat
                (in_stack_fffffffffffffbc0,
                 (Message *)
                 CONCAT17(in_stack_fffffffffffffbbf,
                          CONCAT16(in_stack_fffffffffffffbbe,
                                   CONCAT15(in_stack_fffffffffffffbbd,
                                            CONCAT14(in_stack_fffffffffffffbbc,
                                                     in_stack_fffffffffffffbb8)))),
                 (FieldDescriptor *)in_stack_fffffffffffffbb0,
                 (float)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    }
    else {
      io::SafeDoubleToFloat((double)in_stack_fffffffffffffb98);
      Reflection::SetFloat
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                 (FieldDescriptor *)
                 CONCAT17(in_stack_fffffffffffffba7,
                          CONCAT16(in_stack_fffffffffffffba6,
                                   CONCAT15(in_stack_fffffffffffffba5,in_stack_fffffffffffffba0))),
                 (float)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    }
    break;
  case CPPTYPE_BOOL:
    bVar1 = LookingAtType(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
    if (bVar1) {
      bVar1 = ConsumeUnsignedInteger
                        (in_stack_fffffffffffffc18,(uint64 *)in_stack_fffffffffffffc10,
                         in_stack_fffffffffffffc08);
      uVar2 = (undefined1)((ulong)in_stack_fffffffffffffb98 >> 0x38);
      if (!bVar1) {
        local_1 = 0;
        goto LAB_007169fb;
      }
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x715d91);
      if (bVar1) {
        Reflection::AddBool(in_stack_fffffffffffffbc0,
                            (Message *)
                            CONCAT17(in_stack_fffffffffffffbbf,
                                     CONCAT16(in_stack_fffffffffffffbbe,
                                              CONCAT15(in_stack_fffffffffffffbbd,
                                                       CONCAT14(in_stack_fffffffffffffbbc,
                                                                in_stack_fffffffffffffbb8)))),
                            (FieldDescriptor *)in_stack_fffffffffffffbb0,
                            SUB81((ulong)in_stack_fffffffffffffba8 >> 0x38,0));
      }
      else {
        Reflection::SetBool(in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                            (FieldDescriptor *)
                            CONCAT17(in_stack_fffffffffffffba7,
                                     CONCAT16(in_stack_fffffffffffffba6,
                                              CONCAT15(in_stack_fffffffffffffba5,
                                                       in_stack_fffffffffffffba0))),(bool)uVar2);
      }
    }
    else {
      std::__cxx11::string::string(local_f0);
      bVar1 = ConsumeIdentifier(in_stack_fffffffffffffbc8,(string *)in_stack_fffffffffffffbc0);
      if (bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb90,
                                (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88
                                                ));
        if (((bVar1) ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffb90,
                                     (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                      in_stack_fffffffffffffb88)), bVar1)) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffb90,
                                    (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                     in_stack_fffffffffffffb88)), bVar1)) {
          uVar2 = (undefined1)((ulong)in_stack_fffffffffffffb98 >> 0x38);
          bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x715edc);
          if (bVar1) {
            Reflection::AddBool(in_stack_fffffffffffffbc0,
                                (Message *)
                                CONCAT17(in_stack_fffffffffffffbbf,
                                         CONCAT16(in_stack_fffffffffffffbbe,
                                                  CONCAT15(in_stack_fffffffffffffbbd,
                                                           CONCAT14(in_stack_fffffffffffffbbc,
                                                                    in_stack_fffffffffffffbb8)))),
                                (FieldDescriptor *)in_stack_fffffffffffffbb0,
                                SUB81((ulong)in_stack_fffffffffffffba8 >> 0x38,0));
          }
          else {
            Reflection::SetBool(in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                                (FieldDescriptor *)
                                CONCAT17(in_stack_fffffffffffffba7,
                                         CONCAT16(in_stack_fffffffffffffba6,
                                                  CONCAT15(in_stack_fffffffffffffba5,
                                                           in_stack_fffffffffffffba0))),(bool)uVar2)
            ;
          }
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffb90,
                                  (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                   in_stack_fffffffffffffb88));
          if (((!bVar1) &&
              (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffffb90,
                                       (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                        in_stack_fffffffffffffb88)), !bVar1)) &&
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffb90,
                                      (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                       in_stack_fffffffffffffb88)), !bVar1)) {
            FieldDescriptor::name_abi_cxx11_(local_28);
            std::operator+(in_stack_fffffffffffffbd8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffbd7,
                                    CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)));
            std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
            std::operator+(in_stack_fffffffffffffb98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffb90);
            std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
            ReportError((ParserImpl *)
                        CONCAT17(in_stack_fffffffffffffba7,
                                 CONCAT16(in_stack_fffffffffffffba6,
                                          CONCAT15(in_stack_fffffffffffffba5,
                                                   in_stack_fffffffffffffba0))),
                        in_stack_fffffffffffffb98);
            std::__cxx11::string::~string(local_110);
            std::__cxx11::string::~string(local_130);
            std::__cxx11::string::~string(local_150);
            std::__cxx11::string::~string(local_170);
            local_1 = 0;
            local_88 = 1;
            goto LAB_0071618e;
          }
          uVar2 = (undefined1)((ulong)in_stack_fffffffffffffb98 >> 0x38);
          bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x715fb6);
          if (bVar1) {
            Reflection::AddBool(in_stack_fffffffffffffbc0,
                                (Message *)
                                CONCAT17(in_stack_fffffffffffffbbf,
                                         CONCAT16(in_stack_fffffffffffffbbe,
                                                  CONCAT15(in_stack_fffffffffffffbbd,
                                                           CONCAT14(in_stack_fffffffffffffbbc,
                                                                    in_stack_fffffffffffffbb8)))),
                                (FieldDescriptor *)in_stack_fffffffffffffbb0,
                                SUB81((ulong)in_stack_fffffffffffffba8 >> 0x38,0));
          }
          else {
            Reflection::SetBool(in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                                (FieldDescriptor *)
                                CONCAT17(in_stack_fffffffffffffba7,
                                         CONCAT16(in_stack_fffffffffffffba6,
                                                  CONCAT15(in_stack_fffffffffffffba5,
                                                           in_stack_fffffffffffffba0))),(bool)uVar2)
            ;
          }
        }
        local_88 = 0;
      }
      else {
        local_1 = 0;
        local_88 = 1;
      }
LAB_0071618e:
      std::__cxx11::string::~string(local_f0);
      if (local_88 != 0) goto LAB_007169fb;
    }
    break;
  case CPPTYPE_ENUM:
    std::__cxx11::string::string(local_190);
    local_198 = 0x7fffffffffffffff;
    __lhs = FieldDescriptor::enum_type((FieldDescriptor *)in_stack_fffffffffffffb90);
    local_1a8 = (Reflection *)0x0;
    local_1a0 = __lhs;
    uVar2 = LookingAtType(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
    if ((bool)uVar2) {
      in_stack_fffffffffffffbd6 =
           ConsumeIdentifier(in_stack_fffffffffffffbc8,(string *)in_stack_fffffffffffffbc0);
      if ((bool)in_stack_fffffffffffffbd6) {
        local_1a8 = (Reflection *)
                    EnumDescriptor::FindValueByName
                              ((EnumDescriptor *)in_stack_fffffffffffffba8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffba7,
                                        CONCAT16(in_stack_fffffffffffffba6,
                                                 CONCAT15(in_stack_fffffffffffffba5,
                                                          in_stack_fffffffffffffba0))));
LAB_007164fb:
        if (local_1a8 == (Reflection *)0x0) {
          if ((local_198 == 0x7fffffffffffffff) ||
             (in_stack_fffffffffffffba7 =
                   Reflection::SupportsUnknownEnumValues((Reflection *)0x71652f),
             !(bool)in_stack_fffffffffffffba7)) {
            if ((*(byte *)(in_RDI + 0xf7) & 1) == 0) {
              std::operator+((char *)__lhs,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffbd6,
                                                     in_stack_fffffffffffffbd0)));
              std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
              FieldDescriptor::name_abi_cxx11_(local_28);
              std::operator+(in_stack_fffffffffffffb98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb90);
              std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
              ReportError((ParserImpl *)
                          CONCAT17(in_stack_fffffffffffffba7,
                                   CONCAT16(in_stack_fffffffffffffba6,
                                            CONCAT15(in_stack_fffffffffffffba5,
                                                     in_stack_fffffffffffffba0))),
                          in_stack_fffffffffffffb98);
              std::__cxx11::string::~string(local_260);
              std::__cxx11::string::~string(local_280);
              std::__cxx11::string::~string(local_2a0);
              std::__cxx11::string::~string(local_2c0);
              local_1 = 0;
              local_88 = 1;
            }
            else {
              std::operator+((char *)__lhs,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffbd6,
                                                     in_stack_fffffffffffffbd0)));
              std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
              FieldDescriptor::name_abi_cxx11_(local_28);
              std::operator+(in_stack_fffffffffffffb98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb90);
              std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
              ReportWarning((ParserImpl *)
                            CONCAT17(in_stack_fffffffffffffba7,
                                     CONCAT16(in_stack_fffffffffffffba6,
                                              CONCAT15(in_stack_fffffffffffffba5,
                                                       in_stack_fffffffffffffba0))),
                            in_stack_fffffffffffffb98);
              std::__cxx11::string::~string(local_2e0);
              std::__cxx11::string::~string(local_300);
              std::__cxx11::string::~string(local_320);
              std::__cxx11::string::~string(local_340);
              local_1 = 1;
              local_88 = 1;
            }
          }
          else {
            bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x71654f);
            value_02 = (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
            if (bVar1) {
              Reflection::AddEnumValue
                        (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                         (FieldDescriptor *)
                         CONCAT17(in_stack_fffffffffffffba7,
                                  CONCAT16(bVar1,CONCAT15(in_stack_fffffffffffffba5,
                                                          in_stack_fffffffffffffba0))),value_02);
            }
            else {
              Reflection::SetEnumValue
                        (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                         (FieldDescriptor *)
                         CONCAT17(in_stack_fffffffffffffba7,
                                  CONCAT16(bVar1,CONCAT15(in_stack_fffffffffffffba5,
                                                          in_stack_fffffffffffffba0))),value_02);
            }
            local_1 = 1;
            local_88 = 1;
          }
        }
        else {
          bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x7168cf);
          if (bVar1) {
            Reflection::AddEnum(in_stack_fffffffffffffbc0,
                                (Message *)
                                CONCAT17(in_stack_fffffffffffffbbf,
                                         CONCAT16(in_stack_fffffffffffffbbe,
                                                  CONCAT15(in_stack_fffffffffffffbbd,
                                                           CONCAT14(in_stack_fffffffffffffbbc,
                                                                    in_stack_fffffffffffffbb8)))),
                                (FieldDescriptor *)in_stack_fffffffffffffbb0,
                                (EnumValueDescriptor *)in_stack_fffffffffffffba8);
          }
          else {
            Reflection::SetEnum(in_stack_fffffffffffffbc0,
                                (Message *)
                                CONCAT17(in_stack_fffffffffffffbbf,
                                         CONCAT16(in_stack_fffffffffffffbbe,
                                                  CONCAT15(in_stack_fffffffffffffbbd,
                                                           CONCAT14(in_stack_fffffffffffffbbc,
                                                                    in_stack_fffffffffffffbb8)))),
                                (FieldDescriptor *)in_stack_fffffffffffffbb0,
                                (EnumValueDescriptor *)in_stack_fffffffffffffba8);
          }
          local_88 = 2;
        }
      }
      else {
        local_1 = 0;
        local_88 = 1;
      }
    }
    else {
      in_stack_fffffffffffffbc0 = (Reflection *)local_1c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1c9 + 1),"-",(allocator *)in_stack_fffffffffffffbc0);
      bVar1 = LookingAt(in_stack_fffffffffffffb90,
                        (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      in_stack_fffffffffffffbbd = true;
      if (!bVar1) {
        in_stack_fffffffffffffbbe =
             LookingAtType(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
        in_stack_fffffffffffffbbd = in_stack_fffffffffffffbbe;
      }
      in_stack_fffffffffffffbbf = in_stack_fffffffffffffbbd;
      std::__cxx11::string::~string((string *)(local_1c9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1c9);
      if ((in_stack_fffffffffffffbbd & 1) == 0) {
        io::Tokenizer::current((Tokenizer *)(in_RDI + 0x28));
        std::operator+((char *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0))
                      );
        ReportError((ParserImpl *)
                    CONCAT17(in_stack_fffffffffffffba7,
                             CONCAT16(in_stack_fffffffffffffba6,
                                      CONCAT15(in_stack_fffffffffffffba5,in_stack_fffffffffffffba0))
                            ),in_stack_fffffffffffffb98);
        std::__cxx11::string::~string(local_240);
        local_1 = 0;
        local_88 = 1;
      }
      else {
        in_stack_fffffffffffffbbc =
             ConsumeSignedInteger
                       (in_stack_fffffffffffffbf8,
                        (int64 *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                        (uint64)in_stack_fffffffffffffbe8);
        if ((bool)in_stack_fffffffffffffbbc) {
          strings::AlphaNum::AlphaNum
                    ((AlphaNum *)in_stack_fffffffffffffb90,
                     CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
          StrCat_abi_cxx11_((AlphaNum *)in_stack_fffffffffffffbc8);
          in_stack_fffffffffffffba8 = local_1f0;
          std::__cxx11::string::operator=(local_190,in_stack_fffffffffffffba8);
          std::__cxx11::string::~string(in_stack_fffffffffffffba8);
          in_stack_fffffffffffffbb0 =
               (Reflection *)
               EnumDescriptor::FindValueByNumber
                         ((EnumDescriptor *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
          local_1a8 = in_stack_fffffffffffffbb0;
          goto LAB_007164fb;
        }
        local_1 = 0;
        local_88 = 1;
      }
    }
    std::__cxx11::string::~string(local_190);
    goto joined_r0x00715d1b;
  case CPPTYPE_STRING:
    std::__cxx11::string::string(local_78);
    bVar1 = ConsumeString(in_stack_fffffffffffffbc8,(string *)in_stack_fffffffffffffbc0);
    if (bVar1) {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x715ba6);
      if (bVar1) {
        std::__cxx11::string::string(local_a8,local_78);
        Reflection::AddString
                  (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8,
                   (FieldDescriptor *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::~string(local_a8);
      }
      else {
        std::__cxx11::string::string(local_c8,local_78);
        Reflection::SetString
                  ((Reflection *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,local_28,
                   local_18);
        std::__cxx11::string::~string(local_c8);
      }
      local_88 = 2;
    }
    else {
      local_1 = 0;
      local_88 = 1;
    }
    std::__cxx11::string::~string(local_78);
joined_r0x00715d1b:
    if (local_88 == 1) goto LAB_007169fb;
    break;
  case CPPTYPE_MESSAGE:
    this_00 = &local_378;
    internal::LogMessage::LogMessage
              ((LogMessage *)
               CONCAT17(in_stack_fffffffffffffba7,
                        CONCAT16(in_stack_fffffffffffffba6,
                                 CONCAT15(in_stack_fffffffffffffba5,in_stack_fffffffffffffba0))),
               (LogLevel)((ulong)in_stack_fffffffffffffb98 >> 0x20),(char *)this_00,
               in_stack_fffffffffffffb8c);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    internal::LogMessage::~LogMessage((LogMessage *)0x7169ce);
  }
  local_1 = 1;
LAB_007169fb:
  return (bool)(local_1 & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                    \
  if (field->is_repeated()) {                        \
    reflection->Add##CPPTYPE(message, field, VALUE); \
  } else {                                           \
    reflection->Set##CPPTYPE(message, field, VALUE); \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name() +
                        "\". Value: \"" + value + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64 int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              reflection->SupportsUnknownEnumValues()) {
            SET_FIELD(EnumValue, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value +
                        "\" for "
                        "field \"" +
                        field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value +
                          "\" for "
                          "field \"" +
                          field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }